

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O1

void __thiscall diff_match_patch_test::testPatchFromText(diff_match_patch_test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar3;
  _Map_pointer ppPVar4;
  wstring *pwVar5;
  wstring *pwVar6;
  wstring ex;
  wstring strp;
  wstring local_170;
  wstring local_150;
  long *local_130 [2];
  long local_120 [2];
  wstring local_110;
  undefined1 local_f0 [48];
  _Elt_pointer local_c0;
  wstring local_a0;
  deque<Patch,_std::allocator<Patch>_> local_80;
  
  paVar3 = &local_a0.field_2;
  local_a0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_a0,L"patch_fromText: #0.",L"");
  paVar1 = &local_170.field_2;
  local_170._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_170,L"");
  pwVar5 = (wstring *)local_f0;
  diff_match_patch::patch_fromText(pwVar5);
  assertTrue((diff_match_patch_test *)pwVar5,&local_a0,local_c0 == (_Elt_pointer)local_f0._16_8_);
  std::deque<Patch,_std::allocator<Patch>_>::~deque
            ((deque<Patch,_std::allocator<Patch>_> *)local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_170._M_dataplus._M_p != paVar1) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_a0._M_dataplus._M_p != paVar3) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity * 4 + 4);
  }
  local_a0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_a0,
             L"@@ -21,18 +22,17 @@\n jump\n-s\n+ed\n  over \n-the\n+a\n %0Alaz\n",L"");
  local_170._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_170,L"patch_fromText: #1.",L"");
  diff_match_patch::patch_fromText((wstring *)local_f0);
  pwVar6 = &local_150;
  Patch::toString_abi_cxx11_();
  assertEquals((diff_match_patch_test *)pwVar6,&local_170,&local_a0,&local_150);
  paVar3 = &local_150.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_150._M_dataplus._M_p != paVar3) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity * 4 + 4);
  }
  std::deque<Patch,_std::allocator<Patch>_>::~deque
            ((deque<Patch,_std::allocator<Patch>_> *)local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_170._M_dataplus._M_p != paVar1) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity * 4 + 4);
  }
  local_170._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_170,L"patch_fromText: #2.",L"");
  local_150._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_150,L"@@ -1 +1 @@\n-a\n+b\n",L"");
  local_130[0] = local_120;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)local_130,L"@@ -1 +1 @@\n-a\n+b\n",L"");
  diff_match_patch::patch_fromText((wstring *)local_f0);
  pwVar6 = &local_110;
  Patch::toString_abi_cxx11_();
  assertEquals((diff_match_patch_test *)pwVar6,&local_170,&local_150,&local_110);
  paVar2 = &local_110.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_110._M_dataplus._M_p != paVar2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity * 4 + 4);
  }
  std::deque<Patch,_std::allocator<Patch>_>::~deque
            ((deque<Patch,_std::allocator<Patch>_> *)local_f0);
  if (local_130[0] != local_120) {
    operator_delete(local_130[0],local_120[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_150._M_dataplus._M_p != paVar3) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_170._M_dataplus._M_p != paVar1) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity * 4 + 4);
  }
  local_170._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_170,L"patch_fromText: #3.",L"");
  local_150._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_150,L"@@ -1,3 +0,0 @@\n-abc\n",L"");
  local_130[0] = local_120;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)local_130,L"@@ -1,3 +0,0 @@\n-abc\n",L"");
  diff_match_patch::patch_fromText((wstring *)local_f0);
  pwVar6 = &local_110;
  Patch::toString_abi_cxx11_();
  assertEquals((diff_match_patch_test *)pwVar6,&local_170,&local_150,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_110._M_dataplus._M_p != paVar2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity * 4 + 4);
  }
  std::deque<Patch,_std::allocator<Patch>_>::~deque
            ((deque<Patch,_std::allocator<Patch>_> *)local_f0);
  if (local_130[0] != local_120) {
    operator_delete(local_130[0],local_120[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_150._M_dataplus._M_p != paVar3) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_170._M_dataplus._M_p != paVar1) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity * 4 + 4);
  }
  local_170._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_170,L"patch_fromText: #4.",L"");
  local_150._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)&local_150,L"@@ -0,0 +1,3 @@\n+abc\n",L"");
  local_130[0] = local_120;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)local_130,L"@@ -0,0 +1,3 @@\n+abc\n",L"");
  diff_match_patch::patch_fromText((wstring *)local_f0);
  pwVar6 = &local_110;
  Patch::toString_abi_cxx11_();
  assertEquals((diff_match_patch_test *)pwVar6,&local_170,&local_150,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_110._M_dataplus._M_p != paVar2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity * 4 + 4);
  }
  std::deque<Patch,_std::allocator<Patch>_>::~deque
            ((deque<Patch,_std::allocator<Patch>_> *)local_f0);
  if (local_130[0] != local_120) {
    operator_delete(local_130[0],local_120[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_150._M_dataplus._M_p != paVar3) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_170._M_dataplus._M_p != paVar1) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity * 4 + 4);
  }
  ppPVar4 = (_Map_pointer)(local_f0 + 0x10);
  local_f0._0_8_ = ppPVar4;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_f0,L"Bad\nPatch\n",L"");
  diff_match_patch::patch_fromText((wstring *)&local_80);
  std::deque<Patch,_std::allocator<Patch>_>::~deque(&local_80);
  if ((_Map_pointer)local_f0._0_8_ != ppPVar4) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ * 4 + 4);
  }
  pwVar5 = (wstring *)local_f0;
  local_f0._0_8_ = ppPVar4;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>(pwVar5,L"patch_fromText: #5.",L"");
  assertFalse((diff_match_patch_test *)pwVar5,(wstring *)local_f0,true);
  if ((_Map_pointer)local_f0._0_8_ != ppPVar4) {
    operator_delete((void *)local_f0._0_8_,local_f0._16_8_ * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity * 4 + 4);
  }
  return;
}

Assistant:

void diff_match_patch_test::testPatchFromText() {
  assertTrue(L"patch_fromText: #0.", dmp.patch_fromText(L"").empty());

  std::wstring strp = L"@@ -21,18 +22,17 @@\n jump\n-s\n+ed\n  over \n-the\n+a\n %0Alaz\n";
  assertEquals(L"patch_fromText: #1.", strp, dmp.patch_fromText(strp)[0].toString());

  assertEquals(L"patch_fromText: #2.", L"@@ -1 +1 @@\n-a\n+b\n", dmp.patch_fromText(L"@@ -1 +1 @@\n-a\n+b\n")[0].toString());

  assertEquals(L"patch_fromText: #3.", L"@@ -1,3 +0,0 @@\n-abc\n", dmp.patch_fromText(L"@@ -1,3 +0,0 @@\n-abc\n")[0].toString());

  assertEquals(L"patch_fromText: #4.", L"@@ -0,0 +1,3 @@\n+abc\n", dmp.patch_fromText(L"@@ -0,0 +1,3 @@\n+abc\n")[0].toString());

  // Generates error.
  try {
    dmp.patch_fromText(L"Bad\nPatch\n");
    assertFalse(L"patch_fromText: #5.", true);
  } catch (std::wstring ex) {
    // Exception expected.
  }
}